

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# globals.c
# Opt level: O1

xmlGlobalStatePtr xmlGetThreadLocalStorage(int allowFailure)

{
  uint uVar1;
  xmlGlobalStatePtr __s;
  
  xmlInitParser();
  __s = (xmlGlobalStatePtr)pthread_getspecific(globalkey);
  if (__s == (xmlGlobalStatePtr)0x0) {
    __s = (xmlGlobalStatePtr)malloc(0xd0);
    if (__s == (xmlGlobalStatePtr)0x0) {
      if (allowFailure != 0) {
        return (xmlGlobalStatePtr)0x0;
      }
      xmlAbort(
              "libxml2: Failed to allocate globals for thread\nlibxml2: See xmlCheckThreadLocalStorage\n"
              );
    }
    memset(__s,0,0xd0);
    uVar1 = xmlGlobalRandom();
    __s->localRngState[0] = uVar1;
    uVar1 = xmlGlobalRandom();
    __s->localRngState[1] = uVar1;
    (__s->lastError).domain = 0;
    (__s->lastError).code = 0;
    (__s->lastError).message = (char *)0x0;
    *(undefined8 *)&(__s->lastError).level = 0;
    (__s->lastError).file = (char *)0x0;
    *(undefined8 *)&(__s->lastError).line = 0;
    (__s->lastError).str1 = (char *)0x0;
    (__s->lastError).str2 = (char *)0x0;
    (__s->lastError).str3 = (char *)0x0;
    (__s->lastError).int1 = 0;
    (__s->lastError).int2 = 0;
    (__s->lastError).ctxt = (void *)0x0;
    (__s->lastError).node = (void *)0x0;
    xmlMutexLock(&xmlThrDefMutex);
    __s->doValidityCheckingDefaultValue = xmlDoValidityCheckingDefaultValueThrDef;
    __s->getWarningsDefaultValue = xmlGetWarningsDefaultValueThrDef;
    __s->keepBlanksDefaultValue = xmlKeepBlanksDefaultValueThrDef;
    __s->lineNumbersDefaultValue = xmlLineNumbersDefaultValueThrDef;
    __s->loadExtDtdDefaultValue = xmlLoadExtDtdDefaultValueThrDef;
    __s->pedanticParserDefaultValue = xmlPedanticParserDefaultValueThrDef;
    __s->substituteEntitiesDefaultValue = xmlSubstituteEntitiesDefaultValueThrDef;
    __s->indentTreeOutput = xmlIndentTreeOutputThrDef;
    __s->treeIndentString = xmlTreeIndentStringThrDef;
    __s->saveNoEmptyTags = xmlSaveNoEmptyTagsThrDef;
    __s->genericError = xmlGenericErrorThrDef;
    __s->structuredError = xmlStructuredErrorThrDef;
    __s->genericErrorContext = xmlGenericErrorContextThrDef;
    __s->structuredErrorContext = xmlStructuredErrorContextThrDef;
    __s->registerNodeDefaultValue = xmlRegisterNodeDefaultValueThrDef;
    __s->deregisterNodeDefaultValue = xmlDeregisterNodeDefaultValueThrDef;
    __s->parserInputBufferCreateFilenameValue = xmlParserInputBufferCreateFilenameValueThrDef;
    __s->outputBufferCreateFilenameValue = xmlOutputBufferCreateFilenameValueThrDef;
    xmlMutexUnlock(&xmlThrDefMutex);
    pthread_setspecific(globalkey,__s);
  }
  return __s;
}

Assistant:

static xmlGlobalStatePtr
xmlGetThreadLocalStorage(int allowFailure) {
    xmlGlobalState *gs;

    (void) allowFailure;

    xmlInitParser();

#ifdef USE_TLS
    gs = &globalState;
    if (gs->initialized == 0)
        xmlInitGlobalState(gs);
#elif defined(HAVE_POSIX_THREADS)
    gs = (xmlGlobalState *) pthread_getspecific(globalkey);
    if (gs == NULL)
        gs = xmlNewGlobalState(allowFailure);
#elif defined(HAVE_WIN32_THREADS)
    gs = (xmlGlobalState *) TlsGetValue(globalkey);
    if (gs == NULL)
        gs = xmlNewGlobalState(allowFailure);
#else
    gs = NULL;
#endif

    return(gs);
}